

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

void __thiscall duckdb::GlobalSortState::PrepareMergePhase(GlobalSortState *this)

{
  pointer puVar1;
  byte bVar2;
  pointer pSVar3;
  idx_t iVar4;
  idx_t iVar5;
  pointer pSVar6;
  ulong uVar7;
  iterator __begin2;
  pointer puVar8;
  long lVar9;
  
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = 0;
  for (puVar8 = (this->sorted_blocks).
                super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->(puVar8);
    iVar4 = SortedBlock::HeapSize(pSVar3);
    lVar9 = lVar9 + iVar4;
  }
  if (this->external == false) {
    bVar2 = 0;
    if ((this->pinned_blocks).
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->pinned_blocks).
        super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
        super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_01934d0a;
    iVar4 = BufferManager::GetQueryMaxMemory(this->buffer_manager);
    if ((ulong)(lVar9 * 4) < iVar4 || lVar9 * 4 - iVar4 == 0) {
      bVar2 = this->external;
      goto LAB_01934d0a;
    }
  }
  this->external = true;
  bVar2 = 1;
LAB_01934d0a:
  puVar8 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->sorted_blocks).
           super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((lVar9 == 0) || ((bVar2 & 1) == 0)) {
    for (; puVar8 != puVar1; puVar8 = puVar8 + 1) {
      uVar7 = this->block_capacity;
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar8);
      iVar4 = SortedBlock::Count(pSVar3);
      if (iVar4 < uVar7) {
        iVar4 = uVar7;
      }
      this->block_capacity = iVar4;
    }
  }
  else {
    uVar7 = 0;
    for (; puVar8 != puVar1; puVar8 = puVar8 + 1) {
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar8);
      iVar4 = SortedBlock::SizeInBytes(pSVar3);
      if (uVar7 < iVar4) {
        pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
                 operator->(puVar8);
        iVar5 = SortedBlock::Count(pSVar3);
        this->block_capacity = iVar5;
        uVar7 = iVar4;
      }
    }
  }
  if (this->external == false) {
    puVar1 = (this->sorted_blocks).
             super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar8 = (this->sorted_blocks).
                  super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1)
    {
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar8);
      pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar3->blob_sorting_data);
      SortedData::Unswizzle(pSVar6);
      pSVar3 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
               operator->(puVar8);
      pSVar6 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->(&pSVar3->payload_data);
      SortedData::Unswizzle(pSVar6);
    }
  }
  return;
}

Assistant:

void GlobalSortState::PrepareMergePhase() {
	// Determine if we need to use do an external sort
	idx_t total_heap_size =
	    std::accumulate(sorted_blocks.begin(), sorted_blocks.end(), (idx_t)0,
	                    [](idx_t a, const unique_ptr<SortedBlock> &b) { return a + b->HeapSize(); });
	if (external || (pinned_blocks.empty() && total_heap_size * 4 > buffer_manager.GetQueryMaxMemory())) {
		external = true;
	}
	// Use the data that we have to determine which partition size to use during the merge
	if (external && total_heap_size > 0) {
		// If we have variable size data we need to be conservative, as there might be skew
		idx_t max_block_size = 0;
		for (auto &sb : sorted_blocks) {
			idx_t size_in_bytes = sb->SizeInBytes();
			if (size_in_bytes > max_block_size) {
				max_block_size = size_in_bytes;
				block_capacity = sb->Count();
			}
		}
	} else {
		for (auto &sb : sorted_blocks) {
			block_capacity = MaxValue(block_capacity, sb->Count());
		}
	}
	// Unswizzle and pin heap blocks if we can fit everything in memory
	if (!external) {
		for (auto &sb : sorted_blocks) {
			sb->blob_sorting_data->Unswizzle();
			sb->payload_data->Unswizzle();
		}
	}
}